

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

string * __thiscall
cppcms::application::url(string *__return_storage_ptr__,application *this,string *key)

{
  ostringstream ss;
  undefined1 auStack_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  context(this);
  http::context::locale((context *)auStack_1a8);
  std::ios::imbue((locale *)(auStack_1a8 + 8));
  std::locale::~locale((locale *)(auStack_1a8 + 8));
  std::locale::~locale((locale *)auStack_1a8);
  url_mapper::map((((this->d).ptr_)->url_map).ptr_,(ostream *)local_198,key);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string application::url(std::string const &key)
{
	std::ostringstream ss;
	ss.imbue(context().locale());
	mapper().map(ss,key);
	return ss.str();
}